

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O2

bool __thiscall cmTarget::CheckImportedLibName(cmTarget *this,string *prop,string *value)

{
  cmMakefile *pcVar1;
  long lVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  if ((this->TargetTypeValue == INTERFACE_LIBRARY) && (this->IsImportedTarget != false)) {
    if (value->_M_string_length == 0) {
      return true;
    }
    if (*(value->_M_dataplus)._M_p == '-') {
      pcVar1 = this->Makefile;
      std::operator+(&local_b0,prop," property value\n  ");
      std::operator+(&local_d0,&local_b0,value);
      std::operator+(&local_f0,&local_d0,"\nmay not start with \'-\'.");
      cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,&local_f0);
      std::__cxx11::string::~string((string *)&local_f0);
      std::__cxx11::string::~string((string *)&local_d0);
      this_00 = &local_b0;
    }
    else {
      lVar2 = std::__cxx11::string::find_first_of((char *)value,0x5ca7c2);
      if (lVar2 == -1) {
        return true;
      }
      pcVar1 = this->Makefile;
      std::operator+(&local_50,prop," property value\n  ");
      std::operator+(&local_70,&local_50,value);
      std::operator+(&local_b0,&local_70,"\nmay not contain \'");
      std::__cxx11::string::substr((ulong)&local_90,(ulong)value);
      std::operator+(&local_d0,&local_b0,&local_90);
      std::operator+(&local_f0,&local_d0,"\'.");
      cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,&local_f0);
      std::__cxx11::string::~string((string *)&local_f0);
      std::__cxx11::string::~string((string *)&local_d0);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&local_b0);
      std::__cxx11::string::~string((string *)&local_70);
      this_00 = &local_50;
    }
  }
  else {
    pcVar1 = this->Makefile;
    std::operator+(&local_f0,prop," property may be set only on imported INTERFACE library targets."
                  );
    cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,&local_f0);
    this_00 = &local_f0;
  }
  std::__cxx11::string::~string((string *)this_00);
  return false;
}

Assistant:

bool cmTarget::CheckImportedLibName(std::string const& prop,
                                    std::string const& value) const
{
  if (this->GetType() != cmStateEnums::INTERFACE_LIBRARY ||
      !this->IsImported()) {
    this->Makefile->IssueMessage(
      cmake::FATAL_ERROR, prop +
        " property may be set only on imported INTERFACE library targets.");
    return false;
  }
  if (!value.empty()) {
    if (value[0] == '-') {
      this->Makefile->IssueMessage(cmake::FATAL_ERROR, prop +
                                     " property value\n  " + value +
                                     "\nmay not start with '-'.");
      return false;
    }
    std::string::size_type bad = value.find_first_of(":/\\;");
    if (bad != std::string::npos) {
      this->Makefile->IssueMessage(
        cmake::FATAL_ERROR, prop + " property value\n  " + value +
          "\nmay not contain '" + value.substr(bad, 1) + "'.");
      return false;
    }
  }
  return true;
}